

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityCapabilities.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EntityCapabilities::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityCapabilities *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"Entity Capabilities");
  poVar1 = std::operator<<(poVar1,"\n\tAmmunition Supply:    ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tFuel Supply:          ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tRecovery Service:     ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tRepair Service:       ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\tADS-B Service:        ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString EntityCapabilities::GetAsString() const
{
    KStringStream ss;

    ss << "Entity Capabilities"
       << "\n\tAmmunition Supply:    " << m_AmmunitionSupply
       << "\n\tFuel Supply:          " << m_FuelSupply
       << "\n\tRecovery Service:     " << m_RecoveryService
       << "\n\tRepair Service:       " << m_RepairService
	   << "\n\tADS-B Service:        " << m_ADSB
       << "\n";

    return ss.str();
}